

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

_Bool ext_ml_model_decision_after_split_part2
                (ExtPartController *ext_part_controller,int is_intra_frame,float *features_prune,
                int *prune_rect_part_horz,int *prune_rect_part_vert)

{
  _Bool _Var1;
  undefined4 *in_RCX;
  long in_RDX;
  int in_ESI;
  int *in_RDI;
  undefined4 *in_R8;
  _Bool valid_decision;
  aom_partition_decision_t decision;
  int i;
  aom_partition_features_t features;
  aom_partition_decision_t *in_stack_ffffffffffffd490;
  ExtPartController *in_stack_ffffffffffffd498;
  undefined4 local_b4c;
  undefined4 local_b48;
  int local_b2c;
  undefined4 auStack_980 [596];
  undefined4 *local_30;
  undefined4 *local_28;
  _Bool local_1;
  
  if ((in_ESI == 0) && (*in_RDI != 0)) {
    for (local_b2c = 0; local_b2c < 9; local_b2c = local_b2c + 1) {
      auStack_980[local_b2c] = *(undefined4 *)(in_RDX + (long)local_b2c * 4);
    }
    local_30 = in_R8;
    local_28 = in_RCX;
    av1_ext_part_send_features
              (in_stack_ffffffffffffd498,(aom_partition_features_t *)in_stack_ffffffffffffd490);
    _Var1 = av1_ext_part_get_partition_decision(in_stack_ffffffffffffd498,in_stack_ffffffffffffd490)
    ;
    if (_Var1) {
      *local_28 = local_b4c;
      *local_30 = local_b48;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ext_ml_model_decision_after_split_part2(
    ExtPartController *const ext_part_controller, const int is_intra_frame,
    const float *const features_prune, int *prune_rect_part_horz,
    int *prune_rect_part_vert) {
  if (is_intra_frame || !ext_part_controller->ready) {
    return false;
  }

  // Setup features.
  aom_partition_features_t features;
  features.id = AOM_EXT_PART_FEATURE_AFTER_SPLIT_PART2;
  for (int i = 0; i < 9; ++i) {
    features.after_part_split.f_prune_rect[i] = features_prune[i];
  }

  // Send necessary features to the external model.
  av1_ext_part_send_features(ext_part_controller, &features);

  // Get partition decisions from the external model.
  aom_partition_decision_t decision;
  const bool valid_decision =
      av1_ext_part_get_partition_decision(ext_part_controller, &decision);
  if (!valid_decision) return false;

  // Populate decisions
  *prune_rect_part_horz = decision.prune_rect_part[0];
  *prune_rect_part_vert = decision.prune_rect_part[1];

  return true;
}